

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void Test_Template_GetTemplate::Run(void)

{
  char *s;
  Template *pTVar1;
  bool bVar2;
  allocator local_1e9;
  string local_1e8 [32];
  Template *local_1c8;
  Template *tpl9;
  string local_1b8 [32];
  Template *local_198;
  Template *tpl8;
  string local_188 [32];
  Template *local_168;
  Template *tpl7;
  string local_158 [32];
  Template *local_138;
  Template *tpl6;
  string local_128 [32];
  Template *local_108;
  Template *tpl5;
  long local_e0;
  Template *tpl4;
  long local_b8;
  Template *tpl3;
  long local_90;
  Template *tpl2;
  long local_68;
  Template *tpl1;
  allocator local_49;
  string local_48 [32];
  ctemplate local_28 [8];
  string filename;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"{This is perfectly valid} yay!",&local_49);
  ctemplate::StringToTemplateFile(local_28,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  ctemplate::TemplateString::TemplateString((TemplateString *)&tpl2,(string *)local_28);
  local_68 = ctemplate::Template::GetTemplate((TemplateString *)&tpl2,DO_NOT_STRIP);
  s = (char *)std::__cxx11::string::c_str();
  ctemplate::TemplateString::TemplateString((TemplateString *)&tpl3,s);
  local_90 = ctemplate::Template::GetTemplate((TemplateString *)&tpl3,DO_NOT_STRIP);
  ctemplate::TemplateString::TemplateString((TemplateString *)&tpl4,(string *)local_28);
  local_b8 = ctemplate::Template::GetTemplate((TemplateString *)&tpl4,STRIP_WHITESPACE);
  if (((local_68 == 0) || (local_90 == 0)) || (local_b8 == 0)) {
    printf("ASSERT FAILED, line %d: %s\n",0x45c,"tpl1 && tpl2 && tpl3");
    bVar2 = false;
    if ((local_68 != 0) && (bVar2 = false, local_90 != 0)) {
      bVar2 = local_b8 != 0;
    }
    if (!bVar2) {
      __assert_fail("tpl1 && tpl2 && tpl3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x45c,"static void Test_Template_GetTemplate::Run()");
    }
    exit(1);
  }
  if (local_68 != local_90) {
    printf("ASSERT FAILED, line %d: %s\n",0x45d,"tpl1 == tpl2");
    if (local_68 == local_90) {
      exit(1);
    }
    __assert_fail("tpl1 == tpl2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x45d,"static void Test_Template_GetTemplate::Run()");
  }
  if (local_68 == local_b8) {
    printf("ASSERT FAILED, line %d: %s\n",0x45e,"tpl1 != tpl3");
    if (local_68 != local_b8) {
      exit(1);
    }
    __assert_fail("tpl1 != tpl3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x45e,"static void Test_Template_GetTemplate::Run()");
  }
  ctemplate::TemplateString::TemplateString((TemplateString *)&tpl5,"/yakakak");
  local_e0 = ctemplate::Template::GetTemplate((TemplateString *)&tpl5,STRIP_WHITESPACE);
  if (local_e0 != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x462,"!tpl4");
    if (local_e0 != 0) {
      __assert_fail("!tpl4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x462,"static void Test_Template_GetTemplate::Run()");
    }
    exit(1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"{{This has spaces in it}}",(allocator *)((long)&tpl6 + 7))
  ;
  pTVar1 = ctemplate::StringToTemplate((string *)local_128,DO_NOT_STRIP);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl6 + 7));
  local_108 = pTVar1;
  if (pTVar1 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x466,"!tpl5");
    if (local_108 != (Template *)0x0) {
      __assert_fail("!tpl5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x466,"static void Test_Template_GetTemplate::Run()");
    }
    exit(1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"{{#SEC}}foo",(allocator *)((long)&tpl7 + 7));
  pTVar1 = ctemplate::StringToTemplate((string *)local_158,DO_NOT_STRIP);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl7 + 7));
  local_138 = pTVar1;
  if (pTVar1 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x468,"!tpl6");
    if (local_138 != (Template *)0x0) {
      __assert_fail("!tpl6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x468,"static void Test_Template_GetTemplate::Run()");
    }
    exit(1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"{{#S1}}foo{{/S2}}",(allocator *)((long)&tpl8 + 7));
  pTVar1 = ctemplate::StringToTemplate((string *)local_188,DO_NOT_STRIP);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl8 + 7));
  local_168 = pTVar1;
  if (pTVar1 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x46a,"!tpl7");
    if (local_168 != (Template *)0x0) {
      __assert_fail("!tpl7",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x46a,"static void Test_Template_GetTemplate::Run()");
    }
    exit(1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1b8,"{{#S1}}foo{{#S2}}bar{{/S1}{{/S2}",(allocator *)((long)&tpl9 + 7));
  pTVar1 = ctemplate::StringToTemplate((string *)local_1b8,DO_NOT_STRIP);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tpl9 + 7));
  local_198 = pTVar1;
  if (pTVar1 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x46d,"!tpl8");
    if (local_198 != (Template *)0x0) {
      __assert_fail("!tpl8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x46d,"static void Test_Template_GetTemplate::Run()");
    }
    exit(1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"{{noend",&local_1e9);
  pTVar1 = ctemplate::StringToTemplate((string *)local_1e8,DO_NOT_STRIP);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  local_1c8 = pTVar1;
  if (pTVar1 == (Template *)0x0) {
    std::__cxx11::string::~string((string *)local_28);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0x46f,"!tpl9");
  if (local_1c8 != (Template *)0x0) {
    __assert_fail("!tpl9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x46f,"static void Test_Template_GetTemplate::Run()");
  }
  exit(1);
}

Assistant:

TEST(Template, GetTemplate) {
  // Tests the cache
  string filename = StringToTemplateFile("{This is perfectly valid} yay!");
  Template* tpl1 = Template::GetTemplate(filename, DO_NOT_STRIP);
  Template* tpl2 = Template::GetTemplate(filename.c_str(), DO_NOT_STRIP);
  Template* tpl3 = Template::GetTemplate(filename, STRIP_WHITESPACE);
  ASSERT(tpl1 && tpl2 && tpl3);
  ASSERT(tpl1 == tpl2);
  ASSERT(tpl1 != tpl3);

  // Tests that a nonexistent template returns NULL
  Template* tpl4 = Template::GetTemplate("/yakakak", STRIP_WHITESPACE);
  ASSERT(!tpl4);

  // Tests that syntax errors cause us to return NULL
  Template* tpl5 = StringToTemplate("{{This has spaces in it}}", DO_NOT_STRIP);
  ASSERT(!tpl5);
  Template* tpl6 = StringToTemplate("{{#SEC}}foo", DO_NOT_STRIP);
  ASSERT(!tpl6);
  Template* tpl7 = StringToTemplate("{{#S1}}foo{{/S2}}", DO_NOT_STRIP);
  ASSERT(!tpl7);
  Template* tpl8 = StringToTemplate("{{#S1}}foo{{#S2}}bar{{/S1}{{/S2}",
                                    DO_NOT_STRIP);
  ASSERT(!tpl8);
  Template* tpl9 = StringToTemplate("{{noend", DO_NOT_STRIP);
  ASSERT(!tpl9);
}